

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_NtkIncTravId(Acb_Ntk_t *p)

{
  int iVar1;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkHasObjTravs(p);
  if (iVar1 == 0) {
    Acb_NtkCleanObjTravs(p);
  }
  p->nObjTravs = p->nObjTravs + 1;
  return;
}

Assistant:

static inline void           Acb_NtkIncTravId( Acb_Ntk_t * p )                       { if ( !Acb_NtkHasObjTravs(p) ) Acb_NtkCleanObjTravs(p); p->nObjTravs++;                               }